

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall
sf::Transform::scale(Transform *this,float scaleX,float scaleY,float centerX,float centerY)

{
  Transform *pTVar1;
  undefined1 local_60 [8];
  Transform scaling;
  float centerY_local;
  float centerX_local;
  float scaleY_local;
  float scaleX_local;
  Transform *this_local;
  
  scaling.m_matrix[0xe] = centerY;
  scaling.m_matrix[0xf] = centerX;
  Transform((Transform *)local_60,scaleX,0.0,centerX * (1.0 - scaleX),0.0,scaleY,
            centerY * (1.0 - scaleY),0.0,0.0,1.0);
  pTVar1 = combine(this,(Transform *)local_60);
  return pTVar1;
}

Assistant:

Transform& Transform::scale(float scaleX, float scaleY, float centerX, float centerY)
{
    Transform scaling(scaleX, 0,      centerX * (1 - scaleX),
                      0,      scaleY, centerY * (1 - scaleY),
                      0,      0,      1);

    return combine(scaling);
}